

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

container_t *
container_from_run_range(run_container_t *run,uint32_t min,uint32_t max,uint8_t *typecode_after)

{
  uint64_t *words;
  byte bVar1;
  array_container_t *bits;
  array_container_t *paVar2;
  uint32_t lenminusone;
  int32_t i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  
  bits = (array_container_t *)bitset_container_create();
  *typecode_after = '\x01';
  iVar7 = 0;
  for (lVar3 = 0; lVar3 < run->n_runs; lVar3 = lVar3 + 1) {
    bitset_set_lenrange((uint64_t *)bits->array,(uint)run->runs[lVar3].value,
                        (uint)run->runs[lVar3].length);
    iVar7 = iVar7 + (uint)run->runs[lVar3].length + 1;
  }
  lenminusone = max - min;
  words = (uint64_t *)bits->array;
  uVar5 = (ulong)(min >> 6);
  uVar8 = max >> 6;
  bVar1 = (byte)min;
  if (min >> 6 == uVar8) {
    uVar5 = words[uVar5] &
            (0xffffffffffffffffU >> (0x3fU - (char)lenminusone & 0x3f)) << (bVar1 & 0x3f);
    uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    uVar8 = (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  else {
    uVar6 = (words[uVar5] >> (bVar1 & 0x3f)) << (bVar1 & 0x3f);
    uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
    uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
    uVar6 = ((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    while( true ) {
      uVar5 = uVar5 + 1;
      if (uVar8 <= uVar5) break;
      uVar4 = words[uVar5] - (words[uVar5] >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      uVar6 = (ulong)((int)uVar6 +
                     (uint)(byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                 0x38));
    }
    uVar5 = (words[uVar8] << (~(byte)max & 0x3f)) >> (~(byte)max & 0x3f);
    uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    uVar8 = (int)uVar6 +
            (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  iVar7 = (lenminusone + iVar7 + 1) - uVar8;
  bitset_set_lenrange(words,min,lenminusone);
  bits->cardinality = iVar7;
  if (iVar7 < 0x1001) {
    paVar2 = array_container_from_bitset((bitset_container_t *)bits);
    *typecode_after = '\x02';
    bitset_container_free((bitset_container_t *)bits);
    bits = paVar2;
  }
  return bits;
}

Assistant:

container_t *container_from_run_range(const run_container_t *run, uint32_t min,
                                      uint32_t max, uint8_t *typecode_after) {
    // We expect most of the time to end up with a bitset container
    bitset_container_t *bitset = bitset_container_create();
    *typecode_after = BITSET_CONTAINER_TYPE;
    int32_t union_cardinality = 0;
    for (int32_t i = 0; i < run->n_runs; ++i) {
        uint32_t rle_min = run->runs[i].value;
        uint32_t rle_max = rle_min + run->runs[i].length;
        bitset_set_lenrange(bitset->words, rle_min, rle_max - rle_min);
        union_cardinality += run->runs[i].length + 1;
    }
    union_cardinality += max - min + 1;
    union_cardinality -=
        bitset_lenrange_cardinality(bitset->words, min, max - min);
    bitset_set_lenrange(bitset->words, min, max - min);
    bitset->cardinality = union_cardinality;
    if (bitset->cardinality <= DEFAULT_MAX_SIZE) {
        // we need to convert to an array container
        array_container_t *array = array_container_from_bitset(bitset);
        *typecode_after = ARRAY_CONTAINER_TYPE;
        bitset_container_free(bitset);
        return array;
    }
    return bitset;
}